

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::anon_unknown_0::ExtensionSetTest_CopyFrom_Test::TestBody
          (ExtensionSetTest_CopyFrom_Test *this)

{
  TestAllExtensions message2;
  TestAllExtensions message1;
  TestAllExtensions TStack_68;
  TestAllExtensions local_38;
  
  proto2_unittest::TestAllExtensions::TestAllExtensions(&local_38,(Arena *)0x0);
  proto2_unittest::TestAllExtensions::TestAllExtensions(&TStack_68,(Arena *)0x0);
  TestUtil::SetAllExtensions<proto2_unittest::TestAllExtensions>(&local_38);
  proto2_unittest::TestAllExtensions::CopyFrom(&TStack_68,&local_38);
  TestUtil::ExpectAllExtensionsSet<proto2_unittest::TestAllExtensions>(&TStack_68);
  proto2_unittest::TestAllExtensions::CopyFrom(&TStack_68,&local_38);
  TestUtil::ExpectAllExtensionsSet<proto2_unittest::TestAllExtensions>(&TStack_68);
  proto2_unittest::TestAllExtensions::~TestAllExtensions(&TStack_68);
  proto2_unittest::TestAllExtensions::~TestAllExtensions(&local_38);
  return;
}

Assistant:

TEST(ExtensionSetTest, CopyFrom) {
  unittest::TestAllExtensions message1, message2;

  TestUtil::SetAllExtensions(&message1);
  message2.CopyFrom(message1);
  TestUtil::ExpectAllExtensionsSet(message2);
  message2.CopyFrom(message1);  // exercise copy when fields already exist
  TestUtil::ExpectAllExtensionsSet(message2);
}